

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collect.c
# Opt level: O3

void pnga_pgroup_brdcst(Integer grp_id,Integer type,void *buf,Integer len,Integer originator)

{
  int p_grp;
  uint uVar1;
  
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (0 < (int)(uint)grp_id) {
    uVar1 = (uint)grp_id & 0x7fffffff;
    armci_msg_group_bcast_scope
              (0x14d,buf,(int)len,PGRP_LIST[uVar1].inv_map_proc_list[originator],
               &PGRP_LIST[uVar1].group);
    return;
  }
  armci_msg_bcast(buf,(int)len,(int)originator);
  return;
}

Assistant:

void pnga_pgroup_brdcst(Integer grp_id, Integer type, void *buf,
                             Integer len, Integer originator)
{
    int p_grp = (int)grp_id;
    _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
    if (p_grp > 0) {
#ifdef MSG_COMMS_MPI
       int aroot = PGRP_LIST[p_grp].inv_map_proc_list[originator];
       armci_msg_group_bcast_scope(SCOPE_ALL,buf,(int)len,aroot,(&(PGRP_LIST[p_grp].group)));
#endif
    } else {
       int aroot = (int)originator;
       armci_msg_bcast(buf, (int)len, (int)aroot);
    }
}